

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::SystemLauncher::getWindowsCommandLine
          (string *__return_storage_ptr__,SystemLauncher *this,string *commandLine,bool foreground)

{
  undefined3 in_register_00000009;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (CONCAT31(in_register_00000009,foreground) == 0) {
    ::std::operator+(__return_storage_ptr__,"start \"\" ",commandLine);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_38,"cmd /S /C ",&local_79);
    ::std::operator+(&local_78,&local_38,"\"");
    ::std::operator+(&local_58,&local_78,commandLine);
    ::std::operator+(__return_storage_ptr__,&local_58,"\"");
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemLauncher::getWindowsCommandLine(const std::string& commandLine,
                                                      bool foreground) const
    {
        std::string launch = foreground
                                 ? (std::string("cmd /S /C ") + "\"" + commandLine + "\"")
                                 : ("start \"\" " + commandLine);

        return launch;
    }